

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Matrix * QuaternionToMatrix(Matrix *__return_storage_ptr__,Quaternion q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  __return_storage_ptr__->m12 = 0.0;
  __return_storage_ptr__->m1 = 0.0;
  __return_storage_ptr__->m5 = 0.0;
  __return_storage_ptr__->m9 = 0.0;
  __return_storage_ptr__->m13 = 0.0;
  __return_storage_ptr__->m2 = 0.0;
  __return_storage_ptr__->m6 = 0.0;
  __return_storage_ptr__->m10 = 0.0;
  __return_storage_ptr__->m14 = 0.0;
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 1.0;
  fVar3 = q.x;
  fVar1 = q.y;
  fVar4 = q.z;
  fVar2 = q.w;
  fVar5 = fVar1 * fVar1 + fVar4 * fVar4;
  __return_storage_ptr__->m0 = 1.0 - (fVar5 + fVar5);
  fVar5 = fVar3 * fVar1 + fVar2 * fVar4;
  __return_storage_ptr__->m1 = fVar5 + fVar5;
  fVar5 = fVar3 * fVar4 - fVar1 * fVar2;
  __return_storage_ptr__->m2 = fVar5 + fVar5;
  fVar5 = fVar3 * fVar1 - fVar2 * fVar4;
  __return_storage_ptr__->m4 = fVar5 + fVar5;
  fVar5 = fVar4 * fVar4 + fVar3 * fVar3;
  __return_storage_ptr__->m5 = 1.0 - (fVar5 + fVar5);
  fVar5 = fVar1 * fVar4 + fVar3 * fVar2;
  __return_storage_ptr__->m6 = fVar5 + fVar5;
  fVar5 = fVar1 * fVar2 + fVar3 * fVar4;
  __return_storage_ptr__->m8 = fVar5 + fVar5;
  fVar4 = fVar1 * fVar4 - fVar3 * fVar2;
  __return_storage_ptr__->m9 = fVar4 + fVar4;
  fVar3 = fVar1 * fVar1 + fVar3 * fVar3;
  __return_storage_ptr__->m10 = 1.0 - (fVar3 + fVar3);
  return __return_storage_ptr__;
}

Assistant:

RMAPI Matrix QuaternionToMatrix(Quaternion q)
{
    Matrix result = { 1.0f, 0.0f, 0.0f, 0.0f,
                      0.0f, 1.0f, 0.0f, 0.0f,
                      0.0f, 0.0f, 1.0f, 0.0f,
                      0.0f, 0.0f, 0.0f, 1.0f }; // MatrixIdentity()

    float a2 = q.x*q.x;
    float b2 = q.y*q.y;
    float c2 = q.z*q.z;
    float ac = q.x*q.z;
    float ab = q.x*q.y;
    float bc = q.y*q.z;
    float ad = q.w*q.x;
    float bd = q.w*q.y;
    float cd = q.w*q.z;

    result.m0 = 1 - 2*(b2 + c2);
    result.m1 = 2*(ab + cd);
    result.m2 = 2*(ac - bd);

    result.m4 = 2*(ab - cd);
    result.m5 = 1 - 2*(a2 + c2);
    result.m6 = 2*(bc + ad);

    result.m8 = 2*(ac + bd);
    result.m9 = 2*(bc - ad);
    result.m10 = 1 - 2*(a2 + b2);

    return result;
}